

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

uchar anon_unknown.dwarf_9c70f::ParseEscapeSequence
                (ExpressionContext *ctx,SynBase *source,char *str)

{
  byte bVar1;
  
  if (*str != '\\') {
    __assert_fail("str[0] == \'\\\\\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0xc2,
                  "unsigned char (anonymous namespace)::ParseEscapeSequence(ExpressionContext &, SynBase *, const char *)"
                 );
  }
  bVar1 = str[1];
  if (bVar1 < 0x5c) {
    if (bVar1 == 0x22) {
      return '\"';
    }
    if (bVar1 == 0x27) {
      return '\'';
    }
    if (bVar1 == 0x30) {
      return '\0';
    }
  }
  else if (bVar1 < 0x72) {
    if (bVar1 == 0x5c) {
      return '\\';
    }
    if (bVar1 == 0x6e) {
      return '\n';
    }
  }
  else {
    if (bVar1 == 0x74) {
      return '\t';
    }
    if (bVar1 == 0x72) {
      return '\r';
    }
  }
  ReportAt(ctx,source,str,"ERROR: unknown escape sequence");
  return '\0';
}

Assistant:

unsigned char ParseEscapeSequence(ExpressionContext &ctx, SynBase *source, const char* str)
	{
		assert(str[0] == '\\');

		switch(str[1])
		{
		case 'n':
			return '\n';
		case 'r':
			return '\r';
		case 't':
			return '\t';
		case '0':
			return '\0';
		case '\'':
			return '\'';
		case '\"':
			return '\"';
		case '\\':
			return '\\';
		}

		ReportAt(ctx, source, str, "ERROR: unknown escape sequence");

		return 0;
	}